

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_2> __thiscall
tcu::refract<double,2>(tcu *this,Vector<double,_2> *i,Vector<double,_2> *n,double eta)

{
  int i_1;
  long lVar1;
  Vector<double,_2> *res_3;
  double dVar2;
  double dVar3;
  double res;
  double dVar4;
  Vector<double,_2> VVar5;
  Vector<double,_2> res_2;
  Vector<double,_2> res_1;
  double local_38 [5];
  
  dVar4 = 0.0;
  lVar1 = 0;
  do {
    dVar4 = dVar4 + n->m_data[lVar1] * i->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  dVar2 = 1.0 - eta * eta * (1.0 - dVar4 * dVar4);
  dVar3 = 0.0;
  if (0.0 <= dVar2) {
    local_38[2] = 0.0;
    local_38[3] = 0.0;
    lVar1 = 0;
    do {
      local_38[lVar1 + 2] = i->m_data[lVar1] * eta;
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    dVar3 = 0.0;
    if (dVar2 < 0.0) {
      dVar2 = ::sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    lVar1 = 0;
    do {
      local_38[lVar1] = n->m_data[lVar1] * (eta * dVar4 + dVar2);
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    lVar1 = 0;
    do {
      dVar4 = local_38[lVar1 + 2] - local_38[lVar1];
      *(double *)(this + lVar1 * 8) = dVar4;
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
  }
  else {
    dVar4 = 0.0;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  VVar5.m_data[1] = dVar3;
  VVar5.m_data[0] = dVar4;
  return (Vector<double,_2>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}